

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O1

void test_all_maps<HashObject<4,4>>(int obj_size,int iters)

{
  pointer ppVar1;
  type tVar2;
  _Hash_node_base *p_Var3;
  iterator iVar4;
  iterator iVar5;
  nonempty_iterator ppVar6;
  long lVar7;
  value_type *pvVar8;
  long lVar9;
  iterator iVar10;
  value_type *pvVar11;
  value_type *pvVar12;
  value_type *pvVar13;
  mapped_type *pmVar14;
  iterator iVar15;
  KeyInfo KVar16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  KeyInfo KVar19;
  uint uVar20;
  iterator iVar21;
  pointer psVar22;
  pointer ppVar23;
  pointer end_memory;
  uchar *puVar24;
  size_t start_memory;
  size_t start_memory_00;
  pointer psVar25;
  size_t start_memory_01;
  size_t start_memory_02;
  size_t start_memory_03;
  size_t start_memory_04;
  pointer psVar26;
  KeyInfo KVar27;
  size_t start_memory_05;
  size_t start_memory_06;
  sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  *psVar28;
  sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  *psVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_HashObject<4,_4>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_HashObject<4,_4>,_int>_>_>
  pVar52;
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> set;
  uint local_174;
  undefined1 local_168 [16];
  KeyInfo local_158;
  KeyInfo KStack_150;
  KeyInfo local_148;
  type local_140;
  vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  vStack_138;
  pointer local_120;
  pointer local_118;
  size_type local_110;
  iterator local_108;
  int local_bc;
  int local_b8;
  int local_b4;
  double local_b0;
  int local_a8;
  libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_> local_a2;
  equal_to<HashObject<4,_4>_*> local_a1;
  long local_a0;
  ulong local_98;
  long local_90;
  ulong local_88;
  HashObject<4,_4> local_7c;
  sparse_hashtable_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  local_78;
  
  psVar26 = (pointer)(ulong)(uint)obj_size;
  iVar21._M_current = psVar26;
  printf("\n%s (%d byte objects, %d iterations):\n","SPARSE_HASH_MAP",4);
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      pvVar8->second = iVar31;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)iVar21._M_current
        );
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_138);
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  local_110 = (size_type)obj_size;
  google::
  sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::resize((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)local_168,local_110);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      pvVar8->second = iVar31;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,
         (size_t)iVar21._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_138);
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      pvVar8->second = iVar31;
    } while (obj_size != iVar31);
  }
  iVar31 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      pvVar8->second = iVar31;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,
         (size_t)iVar21._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_138);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_168,local_110,(allocator_type *)&local_108);
  auVar51 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar21._M_current =
         (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar35._8_4_ = (int)puVar24;
    auVar35._0_8_ = puVar24;
    auVar35._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar35 = auVar35 ^ _DAT_0013b020;
    auVar50 = _DAT_0013b010;
    do {
      auVar49 = auVar50 ^ auVar51;
      if ((bool)(~(auVar35._4_4_ < auVar49._4_4_ ||
                  auVar35._0_4_ < auVar49._0_4_ && auVar49._4_4_ == auVar35._4_4_) & 1)) {
        *(int *)(local_168._0_8_ + (long)psVar22 * 4) = (int)psVar22;
      }
      if (auVar49._12_4_ <= auVar35._12_4_ &&
          (auVar49._8_4_ <= auVar35._8_4_ || auVar49._12_4_ != auVar35._12_4_)) {
        *(int *)(local_168._0_8_ + (long)psVar22 * 4 + 4) = (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar7 = auVar50._8_8_;
      auVar50._0_8_ = auVar50._0_8_ + 2;
      auVar50._8_8_ = lVar7 + 2;
    } while (iVar21._M_current != psVar22);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_168);
  time_map_fetch<EasyUseSparseHashMap<HashObject<4,4>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_168,"map_fetch_random");
  if ((__buckets_ptr)local_168._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_168,local_110,(allocator_type *)&local_108);
  auVar51 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar21._M_current =
         (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar36._8_4_ = (int)puVar24;
    auVar36._0_8_ = puVar24;
    auVar36._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar36 = auVar36 ^ _DAT_0013b020;
    auVar49 = _DAT_0013b010;
    do {
      auVar50 = auVar49 ^ auVar51;
      if ((bool)(~(auVar36._4_4_ < auVar50._4_4_ ||
                  auVar36._0_4_ < auVar50._0_4_ && auVar50._4_4_ == auVar36._4_4_) & 1)) {
        *(int *)(local_168._0_8_ + (long)psVar22 * 4) = (int)psVar22;
      }
      if (auVar50._12_4_ <= auVar36._12_4_ &&
          (auVar50._8_4_ <= auVar36._8_4_ || auVar50._12_4_ != auVar36._12_4_)) {
        *(int *)(local_168._0_8_ + (long)psVar22 * 4 + 4) = (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar7 = auVar49._8_8_;
      auVar49._0_8_ = auVar49._0_8_ + 2;
      auVar49._8_8_ = lVar7 + 2;
    } while (iVar21._M_current != psVar22);
  }
  time_map_fetch<EasyUseSparseHashMap<HashObject<4,4>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_168,"map_fetch_sequential");
  if ((__buckets_ptr)local_168._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar30 = 1;
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_7c.i_ = iVar31;
      google::
      sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
      ::find<HashObject<4,4>>
                (&local_108,
                 (sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                  *)local_168,&local_7c);
      local_78.pos.row_begin._M_current =
           (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)vStack_138.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_78.pos.row_end._M_current =
           (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)vStack_138.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_78.pos.row_current._M_current =
           (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)vStack_138.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_78.pos.col_current = (nonempty_iterator)0x0;
      local_78.end.row_begin._M_current =
           (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)vStack_138.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_78.end.row_end._M_current =
           (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)vStack_138.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_78.end.row_current._M_current =
           (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)vStack_138.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_78.end.col_current = (nonempty_iterator)0x0;
      local_78.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)local_168;
      google::
      sparse_hashtable_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::advance_past_deleted(&local_78);
      uVar20 = 1;
      iVar21._M_current = local_108.pos.row_begin._M_current;
      if (((local_108.pos.row_begin._M_current == local_78.pos.row_begin._M_current) &&
          (iVar21._M_current = local_108.pos.row_end._M_current,
          local_108.pos.row_end._M_current == local_78.pos.row_end._M_current)) &&
         (local_108.pos.row_current._M_current == local_78.pos.row_current._M_current)) {
        if (local_108.pos.row_current._M_current == local_108.pos.row_end._M_current) {
          uVar20 = 0;
        }
        else {
          uVar20 = (uint)(local_108.pos.col_current != local_78.pos.col_current);
          iVar21._M_current =
               (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                *)local_108.pos.col_current;
        }
      }
      uVar30 = uVar30 ^ uVar20;
      iVar31 = iVar31 + 1;
    } while (obj_size != iVar31);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_fetch_empty",(double)(lVar9 - lVar7),obj_size,start_memory,(size_t)iVar21._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_138);
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      pvVar8->second = iVar31;
    } while (obj_size != iVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      google::
      sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,
         (size_t)iVar21._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_138);
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht._0_4_ = iVar31;
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_168,(key_type *)&local_108);
      iVar32 = iVar31 + 1;
      pvVar8->second = iVar32;
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      google::
      sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_168,(key_type *)&local_108);
      iVar31 = iVar32;
    } while (iVar32 != obj_size);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,
         (size_t)iVar21._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_138);
  EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                           *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      pvVar8->second = iVar31;
    } while (obj_size != iVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  google::
  sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::begin(&local_78,
          (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
           *)local_168);
  local_108.ht = local_78.ht;
  local_108.pos.row_begin._M_current = local_78.pos.row_begin._M_current;
  local_108.pos.row_end._M_current = local_78.pos.row_end._M_current;
  local_108.pos.row_current._M_current = local_78.pos.row_current._M_current;
  local_108.pos.col_current = local_78.pos.col_current;
  local_108.end.row_begin._M_current = local_78.end.row_begin._M_current;
  local_108.end.row_end._M_current._0_4_ = local_78.end.row_end._M_current._0_4_;
  local_108.end.row_end._M_current._4_4_ = local_78.end.row_end._M_current._4_4_;
  local_108.end.row_current._M_current._0_4_ = local_78.end.row_current._M_current._0_4_;
  local_108.end.row_current._M_current._4_4_ = local_78.end.row_current._M_current._4_4_;
  local_108.end.col_current = local_78.end.col_current;
  local_78.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)vStack_138.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_78.pos.row_end._M_current =
       (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)vStack_138.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_78.pos.row_current._M_current =
       (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)vStack_138.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_78.pos.col_current = (nonempty_iterator)0x0;
  local_78.end.row_begin._M_current =
       (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)vStack_138.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_78.end.row_end._M_current =
       (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)vStack_138.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_78.end.row_current._M_current =
       (sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
        *)vStack_138.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_78.end.col_current = (nonempty_iterator)0x0;
  local_78.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                 *)local_168;
  google::
  sparse_hashtable_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::advance_past_deleted(&local_78);
  ppVar6 = local_78.pos.col_current;
  iVar5._M_current = local_78.pos.row_current._M_current;
  iVar4._M_current = local_78.pos.row_end._M_current;
  iVar21._M_current = local_78.pos.row_begin._M_current;
  uVar30 = 1;
  while (((local_108.pos.row_begin._M_current != iVar21._M_current ||
          (local_108.pos.row_end._M_current != iVar4._M_current)) ||
         ((local_108.pos.row_current._M_current != iVar5._M_current ||
          ((local_108.pos.row_current._M_current != local_108.pos.row_end._M_current &&
           (local_108.pos.col_current != ppVar6))))))) {
    uVar30 = uVar30 ^ *(uint *)(&(local_108.pos.col_current)->first + 1);
    local_108.pos.col_current = (nonempty_iterator)((long)local_108.pos.col_current + 8);
    iVar10._M_current = local_108.pos.row_current._M_current;
    if (local_108.pos.col_current ==
        (local_108.pos.row_current._M_current)->group +
        ((local_108.pos.row_current._M_current)->settings).num_buckets) {
      do {
        iVar10._M_current = local_108.pos.row_current._M_current + 1;
        if (iVar10._M_current == local_108.pos.row_end._M_current) break;
        local_108.pos.col_current = (iVar10._M_current)->group;
        psVar22 = local_108.pos.row_current._M_current + 1;
        local_108.pos.row_current._M_current = iVar10._M_current;
      } while ((psVar22->settings).num_buckets == 0);
    }
    local_108.pos.row_current._M_current = iVar10._M_current;
    google::
    sparse_hashtable_const_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_const_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                *)&local_108);
  }
  iVar21._M_current = local_108.pos.row_current._M_current;
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_iterate",(double)(lVar9 - lVar7),obj_size,start_memory_00,(size_t)iVar21._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             *)&vStack_138);
  putchar(10);
  local_a8 = obj_size + 3;
  if (-1 < obj_size) {
    local_a8 = obj_size;
  }
  local_a8 = local_a8 >> 2;
  lVar7 = 0;
  do {
    uVar33 = (ulong)(int)(&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::
                           kMapSizes)[lVar7];
    local_174 = 1;
    local_a0 = lVar7;
    local_98 = uVar33;
    do {
      g_num_copies = 0;
      g_num_hashes = 0;
      std::chrono::_V2::steady_clock::now();
      iVar31 = local_a8 / (int)uVar33;
      google::
      sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
      ::sparse_hashtable((sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                          *)local_168,0,(HashFn *)&local_7c,&local_a1,(SelectKey *)&local_108,
                         (SetKey *)&local_78,&local_a2);
      dVar34 = NAN;
      local_bc = iVar31;
      if (0 < iVar31) {
        local_b0 = 0.0;
        iVar31 = 0;
        iVar32 = 0;
        do {
          google::
          sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
          ::clear((sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                   *)local_168);
          google::
          sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
          ::resize((sparse_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                    *)local_168,uVar33);
          g_num_copies = 0;
          g_num_hashes = 0;
          local_b8 = iVar32;
          local_90 = std::chrono::_V2::steady_clock::now();
          uVar30 = (int)uVar33 >> 0x1f;
          iVar32 = (int)((long)((ulong)uVar30 << 0x20 | uVar33 & 0xffffffff) /
                        (long)(int)(0x7fffffff / (long)(int)local_174));
          if (-1 < iVar32) {
            uVar20 = iVar32 + 1;
            local_88 = (ulong)uVar20;
            local_b4 = (int)((long)((ulong)uVar30 << 0x20 | uVar33 & 0xffffffff) / (long)(int)uVar20
                            );
            uVar33 = 0;
            psVar28 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                       *)(long)(int)local_174;
            do {
              psVar29 = psVar28;
              iVar32 = local_b4;
              if (0 < local_b4) {
                do {
                  local_108.ht = psVar29;
                  pvVar11 = google::
                            sparse_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
                            ::
                            find_or_insert<google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::DefaultValue>
                                      ((sparse_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::sparse_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
                                        *)local_168,(key_type *)&local_108);
                  iVar31 = iVar31 + 1;
                  pvVar11->second = iVar31;
                  psVar29 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                             *)((long)&(((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                                          *)(long)(int)local_174)->settings).
                                       super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                       .enlarge_threshold_ +
                               (long)&(psVar29->settings).
                                      super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                      .enlarge_threshold_);
                  iVar32 = iVar32 + -1;
                } while (iVar32 != 0);
              }
              uVar33 = uVar33 + 1;
              psVar28 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                         *)((long)&(psVar28->settings).
                                   super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                   .enlarge_threshold_ + 1);
            } while (uVar33 != local_88);
          }
          lVar7 = std::chrono::_V2::steady_clock::now();
          local_b0 = local_b0 + (double)(lVar7 - local_90);
          iVar32 = local_b8 + 1;
          uVar33 = local_98;
        } while (iVar32 != local_bc);
        dVar34 = local_b0 / (double)iVar31;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",dVar34,
             uVar33 & 0xffffffff,(ulong)local_174);
      std::
      vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
      ::~vector(&vStack_138);
      local_174 = local_174 * (int)uVar33;
    } while ((int)local_174 <= (int)uVar33);
    lVar7 = local_a0 + 1;
  } while (local_a0 == 0);
  iVar31 = 0;
  psVar22 = psVar26;
  printf("\n%s (%d byte objects, %d iterations):\n","DENSE_HASH_MAP",4);
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_168,(HashObject<4,_4> *)&local_108);
      iVar31 = iVar31 + 1;
      pvVar12->second = iVar31;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  google::
  dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::resize((dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
            *)local_168,local_110);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_168,(HashObject<4,_4> *)&local_108);
      iVar31 = iVar31 + 1;
      pvVar12->second = iVar31;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_168,(HashObject<4,_4> *)&local_108);
      iVar31 = iVar31 + 1;
      pvVar12->second = iVar31;
    } while (obj_size != iVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_168,(HashObject<4,_4> *)&local_108);
      iVar31 = iVar31 + 1;
      pvVar12->second = iVar31;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_168,local_110,(allocator_type *)&local_108);
  auVar51 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar37._8_4_ = (int)puVar24;
    auVar37._0_8_ = puVar24;
    auVar37._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar25 = (pointer)0x0;
    auVar37 = auVar37 ^ _DAT_0013b020;
    auVar43 = _DAT_0013b010;
    do {
      auVar50 = auVar43 ^ auVar51;
      if ((bool)(~(auVar37._4_4_ < auVar50._4_4_ ||
                  auVar37._0_4_ < auVar50._0_4_ && auVar50._4_4_ == auVar37._4_4_) & 1)) {
        *(int *)(local_168._0_8_ + (long)psVar25 * 4) = (int)psVar25;
      }
      if (auVar50._12_4_ <= auVar37._12_4_ &&
          (auVar50._8_4_ <= auVar37._8_4_ || auVar50._12_4_ != auVar37._12_4_)) {
        *(int *)(local_168._0_8_ + (long)psVar25 * 4 + 4) = (int)psVar25 + 1;
      }
      psVar25 = (pointer)((long)&psVar25->group + 2);
      lVar7 = auVar43._8_8_;
      auVar43._0_8_ = auVar43._0_8_ + 2;
      auVar43._8_8_ = lVar7 + 2;
    } while (psVar22 != psVar25);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_168);
  time_map_fetch<EasyUseDenseHashMap<HashObject<4,4>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_168,"map_fetch_random");
  if ((__buckets_ptr)local_168._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_168,local_110,(allocator_type *)&local_108);
  auVar51 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar38._8_4_ = (int)puVar24;
    auVar38._0_8_ = puVar24;
    auVar38._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar25 = (pointer)0x0;
    auVar38 = auVar38 ^ _DAT_0013b020;
    auVar44 = _DAT_0013b010;
    do {
      auVar50 = auVar44 ^ auVar51;
      if ((bool)(~(auVar38._4_4_ < auVar50._4_4_ ||
                  auVar38._0_4_ < auVar50._0_4_ && auVar50._4_4_ == auVar38._4_4_) & 1)) {
        *(int *)(local_168._0_8_ + (long)psVar25 * 4) = (int)psVar25;
      }
      if (auVar50._12_4_ <= auVar38._12_4_ &&
          (auVar50._8_4_ <= auVar38._8_4_ || auVar50._12_4_ != auVar38._12_4_)) {
        *(int *)(local_168._0_8_ + (long)psVar25 * 4 + 4) = (int)psVar25 + 1;
      }
      psVar25 = (pointer)((long)&psVar25->group + 2);
      lVar7 = auVar44._8_8_;
      auVar44._0_8_ = auVar44._0_8_ + 2;
      auVar44._8_8_ = lVar7 + 2;
    } while (psVar22 != psVar25);
  }
  time_map_fetch<EasyUseDenseHashMap<HashObject<4,4>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_168,"map_fetch_sequential");
  if ((__buckets_ptr)local_168._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  iVar31 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar30 = 1;
  if (0 < obj_size) {
    do {
      local_78.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)CONCAT44(local_78.ht._4_4_,iVar31);
      google::
      dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
      ::find<HashObject<4,4>>
                ((iterator *)&local_108,
                 (dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                  *)local_168,(HashObject<4,_4> *)&local_78);
      psVar22 = (pointer)(ulong)(local_108.pos.row_begin._M_current !=
                                (pointer)(local_120 +
                                         (long)vStack_138.
                                               super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish));
      uVar30 = uVar30 ^ local_108.pos.row_begin._M_current !=
                        (pointer)(local_120 +
                                 (long)vStack_138.
                                       super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
      iVar31 = iVar31 + 1;
    } while (obj_size != iVar31);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_fetch_empty",(double)(lVar9 - lVar7),obj_size,start_memory_01,(size_t)psVar22);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_168,(HashObject<4,_4> *)&local_108);
      iVar31 = iVar31 + 1;
      pvVar12->second = iVar31;
    } while (obj_size != iVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      google::
      dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht._0_4_ = iVar31;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_168,(HashObject<4,_4> *)&local_108);
      iVar32 = iVar31 + 1;
      pvVar12->second = iVar32;
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      google::
      dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_168,(key_type *)&local_108);
      iVar31 = iVar32;
    } while (iVar32 != obj_size);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *)local_168);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                ::find_or_insert<int,HashObject<4,4>>
                          ((dense_hashtable<std::pair<HashObject<4,4>const,int>,HashObject<4,4>,HashFn,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>,int,HashFn,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>::SetKey,std::equal_to<HashObject<4,4>>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>const,int>>>
                            *)local_168,(HashObject<4,_4> *)&local_108);
      iVar31 = iVar31 + 1;
      pvVar12->second = iVar31;
    } while (obj_size != iVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  ppVar1 = local_120 +
           (long)vStack_138.
                 super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  end_memory = local_120;
  if (vStack_138.
      super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    lVar9 = (long)vStack_138.
                  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish << 3;
    do {
      tVar2.i_ = (end_memory->first).i_;
      if ((local_148.empty_key.i_ != tVar2.i_) &&
         (local_140 == (type)0x0 || local_148.delkey.i_ != tVar2.i_)) break;
      end_memory = end_memory + 1;
      lVar9 = lVar9 + -8;
    } while (lVar9 != 0);
  }
  if (end_memory == ppVar1) {
    uVar30 = 1;
  }
  else {
    uVar30 = 1;
    ppVar23 = end_memory;
LAB_0011cbc0:
    do {
      end_memory = end_memory + 1;
      if (end_memory != ppVar1) {
        tVar2.i_ = (end_memory->first).i_;
        if ((local_148.empty_key.i_ == tVar2.i_) ||
           (local_140 != (type)0x0 && local_148.delkey.i_ == tVar2.i_)) goto LAB_0011cbc0;
      }
      uVar30 = uVar30 ^ ppVar23->second;
      ppVar23 = end_memory;
    } while (end_memory != ppVar1);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_iterate",(double)(lVar9 - lVar7),obj_size,start_memory_02,(size_t)end_memory);
  if (local_120 != (pointer)0x0) {
    free(local_120);
  }
  putchar(10);
  lVar7 = 0;
  do {
    uVar33 = (ulong)(int)(&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::
                           kMapSizes)[lVar7];
    local_174 = 1;
    local_a0 = lVar7;
    local_98 = uVar33;
    do {
      g_num_copies = 0;
      g_num_hashes = 0;
      std::chrono::_V2::steady_clock::now();
      iVar31 = local_a8 / (int)uVar33;
      EasyUseDenseHashMap<HashObject<4,_4>_*,_int,_HashFn>::EasyUseDenseHashMap
                ((EasyUseDenseHashMap<HashObject<4,_4>_*,_int,_HashFn> *)local_168);
      dVar34 = NAN;
      local_bc = iVar31;
      if (0 < iVar31) {
        local_b0 = 0.0;
        iVar32 = 0;
        iVar31 = 0;
        do {
          google::
          dense_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
          ::clear((dense_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                   *)local_168);
          google::
          dense_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
          ::resize((dense_hashtable<std::pair<HashObject<4,_4>_*const,_int>,_HashObject<4,_4>_*,_HashFn,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>_*,_int,_HashFn,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>
                    *)local_168,uVar33);
          g_num_copies = 0;
          g_num_hashes = 0;
          local_b8 = iVar31;
          local_90 = std::chrono::_V2::steady_clock::now();
          uVar30 = (int)uVar33 >> 0x1f;
          iVar31 = (int)((long)((ulong)uVar30 << 0x20 | uVar33 & 0xffffffff) /
                        (long)(int)(0x7fffffff / (long)(int)local_174));
          if (-1 < iVar31) {
            uVar20 = iVar31 + 1;
            local_88 = (ulong)uVar20;
            local_b4 = (int)((long)((ulong)uVar30 << 0x20 | uVar33 & 0xffffffff) / (long)(int)uVar20
                            );
            uVar33 = 0;
            psVar28 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                       *)(long)(int)local_174;
            do {
              psVar29 = psVar28;
              iVar31 = local_b4;
              if (0 < local_b4) {
                do {
                  local_108.ht = psVar29;
                  pvVar13 = google::
                            dense_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
                            ::find_or_insert<int,HashObject<4,4>*>
                                      ((dense_hashtable<std::pair<HashObject<4,4>*const,int>,HashObject<4,4>*,HashFn,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<4,4>*,int,HashFn,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>::SetKey,std::equal_to<HashObject<4,4>*>,google::libc_allocator_with_realloc<std::pair<HashObject<4,4>*const,int>>>
                                        *)local_168,(HashObject<4,_4> **)&local_108);
                  iVar32 = iVar32 + 1;
                  pvVar13->second = iVar32;
                  psVar29 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                             *)((long)&(((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                                          *)(long)(int)local_174)->settings).
                                       super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                       .enlarge_threshold_ +
                               (long)&(psVar29->settings).
                                      super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                      .enlarge_threshold_);
                  iVar31 = iVar31 + -1;
                } while (iVar31 != 0);
              }
              uVar33 = uVar33 + 1;
              psVar28 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                         *)((long)&(psVar28->settings).
                                   super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                   .enlarge_threshold_ + 1);
            } while (uVar33 != local_88);
          }
          lVar7 = std::chrono::_V2::steady_clock::now();
          local_b0 = local_b0 + (double)(lVar7 - local_90);
          iVar31 = local_b8 + 1;
          uVar33 = local_98;
        } while (iVar31 != local_bc);
        dVar34 = local_b0 / (double)iVar32;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",dVar34,
             uVar33 & 0xffffffff,(ulong)local_174);
      if (local_118 != (pointer)0x0) {
        free(local_118);
      }
      local_174 = local_174 * (int)uVar33;
    } while ((int)local_174 <= (int)uVar33);
    lVar7 = local_a0 + 1;
  } while (local_a0 == 0);
  psVar22 = psVar26;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD HASH_MAP",4);
  local_168._0_8_ = &vStack_138;
  local_168._8_8_ = (pointer)0x1;
  local_158 = (KeyInfo)0x0;
  KStack_150 = (KeyInfo)0x0;
  local_148.delkey.i_ = 0x3f800000;
  local_140 = (type)0x0;
  vStack_138.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pmVar14 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      *pmVar14 = iVar31;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_168);
  local_168._0_8_ = &vStack_138;
  local_168._8_8_ = (pointer)0x1;
  local_158 = (KeyInfo)0x0;
  KStack_150 = (KeyInfo)0x0;
  local_148.delkey.i_ = 0x3f800000;
  local_140 = (type)0x0;
  vStack_138.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)local_168,local_110);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pmVar14 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      *pmVar14 = iVar31;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_168);
  local_168._0_8_ = &vStack_138;
  local_168._8_8_ = (pointer)0x1;
  local_158 = (KeyInfo)0x0;
  KStack_150 = (KeyInfo)0x0;
  local_148.delkey.i_ = 0x3f800000;
  local_140 = (type)0x0;
  vStack_138.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pmVar14 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      *pmVar14 = iVar31;
    } while (obj_size != iVar31);
  }
  iVar31 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    auVar51 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
    std::
    _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_168);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_168,local_110,(allocator_type *)&local_108
              );
  }
  else {
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pmVar14 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      *pmVar14 = iVar31;
    } while (obj_size != iVar31);
    auVar51 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
    std::
    _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_168);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_168,local_110,(allocator_type *)&local_108
              );
    auVar51 = _DAT_0013b020;
    if (0 < obj_size) {
      psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
      puVar24 = psVar26[-1].bitmap + 5;
      auVar39._8_4_ = (int)puVar24;
      auVar39._0_8_ = puVar24;
      auVar39._12_4_ = (int)((ulong)puVar24 >> 0x20);
      psVar25 = (pointer)0x0;
      auVar39 = auVar39 ^ _DAT_0013b020;
      auVar45 = _DAT_0013b010;
      do {
        auVar50 = auVar45 ^ auVar51;
        if ((bool)(~(auVar39._4_4_ < auVar50._4_4_ ||
                    auVar39._0_4_ < auVar50._0_4_ && auVar50._4_4_ == auVar39._4_4_) & 1)) {
          *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                             *)local_168._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                  (long)psVar25 * 4) = (int)psVar25;
        }
        if (auVar50._12_4_ <= auVar39._12_4_ &&
            (auVar50._8_4_ <= auVar39._8_4_ || auVar50._12_4_ != auVar39._12_4_)) {
          *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                             *)local_168._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                  (long)psVar25 * 4 + 4) = (int)psVar25 + 1;
        }
        psVar25 = (pointer)((long)&psVar25->group + 2);
        lVar7 = auVar45._8_8_;
        auVar45._0_8_ = auVar45._0_8_ + 2;
        auVar45._8_8_ = lVar7 + 2;
      } while (psVar22 != psVar25);
    }
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_168);
  time_map_fetch<EasyUseHashMap<HashObject<4,4>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_168,"map_fetch_random");
  if ((vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)local_168._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_168,local_110,(allocator_type *)&local_108);
  auVar51 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar40._8_4_ = (int)puVar24;
    auVar40._0_8_ = puVar24;
    auVar40._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar25 = (pointer)0x0;
    auVar40 = auVar40 ^ _DAT_0013b020;
    auVar46 = _DAT_0013b010;
    do {
      auVar50 = auVar46 ^ auVar51;
      if ((bool)(~(auVar40._4_4_ < auVar50._4_4_ ||
                  auVar40._0_4_ < auVar50._0_4_ && auVar50._4_4_ == auVar40._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                           *)local_168._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar25 * 4) = (int)psVar25;
      }
      if (auVar50._12_4_ <= auVar40._12_4_ &&
          (auVar50._8_4_ <= auVar40._8_4_ || auVar50._12_4_ != auVar40._12_4_)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                           *)local_168._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar25 * 4 + 4) = (int)psVar25 + 1;
      }
      psVar25 = (pointer)((long)&psVar25->group + 2);
      lVar7 = auVar46._8_8_;
      auVar46._0_8_ = auVar46._0_8_ + 2;
      auVar46._8_8_ = lVar7 + 2;
    } while (psVar22 != psVar25);
  }
  time_map_fetch<EasyUseHashMap<HashObject<4,4>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_168,"map_fetch_sequential");
  if ((vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)local_168._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  local_168._0_8_ = &vStack_138;
  local_168._8_8_ = (pointer)0x1;
  local_158 = (KeyInfo)0x0;
  KStack_150 = (KeyInfo)0x0;
  local_148.delkey.i_ = 0x3f800000;
  local_140 = (type)0x0;
  vStack_138.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    uVar30 = 1;
  }
  else {
    uVar30 = 1;
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      iVar15 = std::
               _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_168,(key_type *)&local_108);
      psVar22 = (pointer)(ulong)(iVar15.
                                 super__Node_iterator_base<std::pair<const_HashObject<4,_4>,_int>,_true>
                                 ._M_cur != (__node_type *)0x0);
      uVar30 = uVar30 ^ iVar15.
                        super__Node_iterator_base<std::pair<const_HashObject<4,_4>,_int>,_true>.
                        _M_cur != (__node_type *)0x0;
      iVar31 = iVar31 + 1;
    } while (obj_size != iVar31);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_fetch_empty",(double)(lVar9 - lVar7),obj_size,start_memory_03,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_168);
  local_168._0_8_ = &vStack_138;
  local_168._8_8_ = (pointer)0x1;
  local_158 = (KeyInfo)0x0;
  KStack_150 = (KeyInfo)0x0;
  local_148.delkey.i_ = 0x3f800000;
  local_140 = (type)0x0;
  vStack_138.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pmVar14 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      *pmVar14 = iVar31;
    } while (obj_size != iVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      std::
      _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_168,&local_108);
      iVar31 = iVar31 + 1;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_168);
  local_168._0_8_ = &vStack_138;
  local_168._8_8_ = (pointer)0x1;
  local_158 = (KeyInfo)0x0;
  KStack_150 = (KeyInfo)0x0;
  local_148.delkey.i_ = 0x3f800000;
  local_140 = (type)0x0;
  vStack_138.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht._0_4_ = iVar31;
      pmVar14 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_168,(key_type *)&local_108);
      iVar32 = iVar31 + 1;
      *pmVar14 = iVar32;
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      std::
      _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_168,&local_108);
      iVar31 = iVar32;
    } while (iVar32 != obj_size);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_168);
  local_168._0_8_ = &vStack_138;
  local_168._8_8_ = (pointer)0x1;
  local_158 = (KeyInfo)0x0;
  KStack_150 = (KeyInfo)0x0;
  local_148.delkey.i_ = 0x3f800000;
  local_140 = (type)0x0;
  vStack_138.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pmVar14 = std::__detail::
                _Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      *pmVar14 = iVar31;
    } while (obj_size != iVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar30 = 1;
  for (KVar16 = local_158; KVar16 != (KeyInfo)0x0;
      KVar16 = (KeyInfo)((_Hash_node_base *)KVar16)->_M_nxt) {
    uVar30 = uVar30 ^ *(uint *)((long)&((_Hash_node_base *)((long)KVar16 + 8))->_M_nxt + 4);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_iterate",(double)(lVar9 - lVar7),obj_size,start_memory_04,(size_t)psVar22);
  std::
  _Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_168);
  putchar(10);
  lVar7 = 0;
  do {
    uVar33 = (ulong)(int)(&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::
                           kMapSizes)[lVar7];
    local_174 = 1;
    local_a0 = lVar7;
    local_98 = uVar33;
    do {
      g_num_copies = 0;
      g_num_hashes = 0;
      std::chrono::_V2::steady_clock::now();
      local_bc = local_a8 / (int)uVar33;
      local_168._0_8_ = &vStack_138;
      local_168._8_8_ = (pointer)0x1;
      local_158 = (KeyInfo)0x0;
      KStack_150 = (KeyInfo)0x0;
      local_148.delkey.i_ = 0x3f800000;
      local_140 = (type)0x0;
      vStack_138.
      super__Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dVar34 = NAN;
      if (0 < local_bc) {
        iVar32 = 0;
        iVar31 = 0;
        dVar34 = 0.0;
        KVar16 = local_158;
        do {
          while (local_b0 = dVar34, local_b8 = iVar31, KVar16 != (KeyInfo)0x0) {
            p_Var3 = ((_Hash_node_base *)KVar16)->_M_nxt;
            operator_delete((void *)KVar16);
            iVar31 = local_b8;
            dVar34 = local_b0;
            KVar16 = (KeyInfo)p_Var3;
          }
          memset((void *)local_168._0_8_,0,local_168._8_8_ << 3);
          local_158 = (KeyInfo)0x0;
          KStack_150 = (KeyInfo)0x0;
          std::
          _Hashtable<HashObject<4,_4>_*,_std::pair<HashObject<4,_4>_*const,_int>,_std::allocator<std::pair<HashObject<4,_4>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::rehash((_Hashtable<HashObject<4,_4>_*,_std::pair<HashObject<4,_4>_*const,_int>,_std::allocator<std::pair<HashObject<4,_4>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_168,uVar33);
          g_num_copies = 0;
          g_num_hashes = 0;
          local_90 = std::chrono::_V2::steady_clock::now();
          uVar30 = (int)uVar33 >> 0x1f;
          iVar31 = (int)((long)((ulong)uVar30 << 0x20 | uVar33 & 0xffffffff) /
                        (long)(int)(0x7fffffff / (long)(int)local_174));
          if (-1 < iVar31) {
            uVar20 = iVar31 + 1;
            local_88 = (ulong)uVar20;
            local_b4 = (int)((long)((ulong)uVar30 << 0x20 | uVar33 & 0xffffffff) / (long)(int)uVar20
                            );
            uVar33 = 0;
            psVar28 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                       *)(long)(int)local_174;
            do {
              psVar29 = psVar28;
              iVar31 = local_b4;
              if (0 < local_b4) {
                do {
                  local_108.ht = psVar29;
                  pmVar17 = std::__detail::
                            _Map_base<HashObject<4,_4>_*,_std::pair<HashObject<4,_4>_*const,_int>,_std::allocator<std::pair<HashObject<4,_4>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<HashObject<4,_4>_*,_std::pair<HashObject<4,_4>_*const,_int>,_std::allocator<std::pair<HashObject<4,_4>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)local_168,(key_type *)&local_108);
                  iVar32 = iVar32 + 1;
                  *pmVar17 = iVar32;
                  psVar29 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                             *)((long)&(((sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                                          *)(long)(int)local_174)->settings).
                                       super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                       .enlarge_threshold_ +
                               (long)&(psVar29->settings).
                                      super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                      .enlarge_threshold_);
                  iVar31 = iVar31 + -1;
                } while (iVar31 != 0);
              }
              uVar33 = uVar33 + 1;
              psVar28 = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                         *)((long)&(psVar28->settings).
                                   super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>
                                   .enlarge_threshold_ + 1);
            } while (uVar33 != local_88);
          }
          lVar7 = std::chrono::_V2::steady_clock::now();
          dVar34 = local_b0 + (double)(lVar7 - local_90);
          iVar31 = local_b8 + 1;
          KVar16 = local_158;
          uVar33 = local_98;
        } while (local_b8 + 1 != local_bc);
        dVar34 = dVar34 / (double)iVar32;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",dVar34,
             uVar33 & 0xffffffff,(ulong)local_174);
      std::
      _Hashtable<HashObject<4,_4>_*,_std::pair<HashObject<4,_4>_*const,_int>,_std::allocator<std::pair<HashObject<4,_4>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<HashObject<4,_4>_*,_std::pair<HashObject<4,_4>_*const,_int>,_std::allocator<std::pair<HashObject<4,_4>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<4,_4>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_168);
      local_174 = local_174 * (int)uVar33;
    } while ((int)local_174 <= (int)uVar33);
    lVar7 = local_a0 + 1;
  } while (local_a0 == 0);
  psVar22 = psVar26;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD MAP",4);
  KVar16 = (KeyInfo)((long)local_168 + 8);
  local_168._8_8_ = local_168._8_8_ & 0xffffffff00000000;
  local_158 = (KeyInfo)0x0;
  local_140 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_150 = KVar16;
  local_148 = KVar16;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pmVar18 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      *pmVar18 = iVar31;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_168);
  local_168._8_8_ = local_168._8_8_ & 0xffffffff00000000;
  local_158 = (KeyInfo)0x0;
  local_140 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_150 = KVar16;
  local_148 = KVar16;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pmVar18 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      *pmVar18 = iVar31;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_168);
  local_168._8_8_ = local_168._8_8_ & 0xffffffff00000000;
  local_158 = (KeyInfo)0x0;
  local_140 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_150 = KVar16;
  local_148 = KVar16;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pmVar18 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      *pmVar18 = iVar31;
    } while (obj_size != iVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    auVar51 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
    std::
    _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                 *)local_168);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_168,local_110,(allocator_type *)&local_108
              );
  }
  else {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pmVar18 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      *pmVar18 = iVar31;
    } while (obj_size != iVar31);
    auVar51 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
    std::
    _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                 *)local_168);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_168,local_110,(allocator_type *)&local_108
              );
    auVar51 = _DAT_0013b020;
    if (0 < obj_size) {
      psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
      puVar24 = psVar26[-1].bitmap + 5;
      auVar41._8_4_ = (int)puVar24;
      auVar41._0_8_ = puVar24;
      auVar41._12_4_ = (int)((ulong)puVar24 >> 0x20);
      psVar25 = (pointer)0x0;
      auVar41 = auVar41 ^ _DAT_0013b020;
      auVar47 = _DAT_0013b010;
      do {
        auVar50 = auVar47 ^ auVar51;
        if ((bool)(~(auVar50._4_4_ == auVar41._4_4_ && auVar41._0_4_ < auVar50._0_4_ ||
                    auVar41._4_4_ < auVar50._4_4_) & 1)) {
          *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                             *)local_168._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                  (long)psVar25 * 4) = (int)psVar25;
        }
        if ((auVar50._12_4_ != auVar41._12_4_ || auVar50._8_4_ <= auVar41._8_4_) &&
            auVar50._12_4_ <= auVar41._12_4_) {
          *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                             *)local_168._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                  (long)psVar25 * 4 + 4) = (int)psVar25 + 1;
        }
        psVar25 = (pointer)((long)&psVar25->group + 2);
        lVar7 = auVar47._8_8_;
        auVar47._0_8_ = auVar47._0_8_ + 2;
        auVar47._8_8_ = lVar7 + 2;
      } while (psVar22 != psVar25);
    }
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_168);
  time_map_fetch<EasyUseMap<HashObject<4,4>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_168,"map_fetch_random");
  if ((vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)local_168._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_168,local_110,(allocator_type *)&local_108);
  auVar51 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar24 = psVar26[-1].bitmap + 5;
    auVar42._8_4_ = (int)puVar24;
    auVar42._0_8_ = puVar24;
    auVar42._12_4_ = (int)((ulong)puVar24 >> 0x20);
    psVar26 = (pointer)0x0;
    auVar42 = auVar42 ^ _DAT_0013b020;
    auVar48 = _DAT_0013b010;
    do {
      auVar50 = auVar48 ^ auVar51;
      if ((bool)(~(auVar50._4_4_ == auVar42._4_4_ && auVar42._0_4_ < auVar50._0_4_ ||
                  auVar42._4_4_ < auVar50._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                           *)local_168._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar26 * 4) = (int)psVar26;
      }
      if ((auVar50._12_4_ != auVar42._12_4_ || auVar50._8_4_ <= auVar42._8_4_) &&
          auVar50._12_4_ <= auVar42._12_4_) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
                           *)local_168._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar26 * 4 + 4) = (int)psVar26 + 1;
      }
      psVar26 = (pointer)((long)&psVar26->group + 2);
      lVar7 = auVar48._8_8_;
      auVar48._0_8_ = auVar48._0_8_ + 2;
      auVar48._8_8_ = lVar7 + 2;
    } while (psVar22 != psVar26);
  }
  time_map_fetch<EasyUseMap<HashObject<4,4>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_168,"map_fetch_sequential");
  if ((vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)local_168._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<4,_4>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<4,_4>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  local_168._8_8_ = local_168._8_8_ & 0xffffffff00000000;
  local_158.delkey.i_ = 0;
  local_158.empty_key.i_ = 0;
  local_140 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_150 = KVar16;
  local_148 = KVar16;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    uVar30 = 1;
  }
  else {
    uVar30 = 1;
    psVar22 = (pointer)0x0;
    do {
      iVar31 = (int)psVar22;
      KVar27 = KVar16;
      for (KVar19 = local_158; KVar19 != (KeyInfo)0x0;
          KVar19 = *(KeyInfo *)((type)((long)KVar19 + 0x10) + (ulong)(iVar32 < iVar31) * 2)) {
        iVar32 = ((type)((long)KVar19 + 0x20))->i_;
        if (iVar31 <= iVar32) {
          KVar27 = KVar19;
        }
      }
      KVar19 = KVar16;
      if ((KVar27 != KVar16) && (KVar19 = KVar27, iVar31 < ((type)((long)KVar27 + 0x20))->i_)) {
        KVar19 = KVar16;
      }
      uVar30 = uVar30 ^ KVar19 != KVar16;
      psVar22 = (pointer)(ulong)(iVar31 + 1U);
    } while (iVar31 + 1U != obj_size);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_fetch_empty",(double)(lVar9 - lVar7),obj_size,start_memory_05,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_168);
  KVar16 = (KeyInfo)((long)local_168 + 8);
  local_168._8_8_ = local_168._8_8_ & 0xffffffff00000000;
  local_158 = (KeyInfo)0x0;
  local_140 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_150 = KVar16;
  local_148 = KVar16;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pmVar18 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      *pmVar18 = iVar31;
    } while (obj_size != iVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pVar52 = std::
               _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_168,(key_type *)&local_108);
      std::
      _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)local_168,(_Base_ptr)pVar52.first._M_node,(_Base_ptr)pVar52.second._M_node);
      iVar31 = iVar31 + 1;
    } while (obj_size != iVar31);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_168);
  local_168._8_8_ = local_168._8_8_ & 0xffffffff00000000;
  local_158 = (KeyInfo)0x0;
  local_140 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_150 = KVar16;
  local_148 = KVar16;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht._0_4_ = iVar31;
      pmVar18 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_168,(key_type *)&local_108);
      iVar32 = iVar31 + 1;
      *pmVar18 = iVar32;
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pVar52 = std::
               _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_168,(key_type *)&local_108);
      std::
      _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)local_168,(_Base_ptr)pVar52.first._M_node,(_Base_ptr)pVar52.second._M_node);
      iVar31 = iVar32;
    } while (iVar32 != obj_size);
  }
  auVar51 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar51._0_8_ - lVar7),obj_size,auVar51._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_168);
  local_168._8_8_ = local_168._8_8_ & 0xffffffff00000000;
  local_158 = (KeyInfo)0x0;
  local_140 = (type)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  KStack_150 = KVar16;
  local_148 = KVar16;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar31 = 0;
    do {
      local_108.ht = (sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                      *)CONCAT44(local_108.ht._4_4_,iVar31);
      pmVar18 = std::
                map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                              *)local_168,(key_type *)&local_108);
      iVar31 = iVar31 + 1;
      *pmVar18 = iVar31;
    } while (obj_size != iVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar30 = 1;
  for (KVar19 = KStack_150; KVar19 != KVar16;
      KVar19 = (KeyInfo)std::_Rb_tree_increment((_Rb_tree_node_base *)KVar19)) {
    uVar30 = uVar30 ^ *(uint *)((long)KVar19 + 0x24);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar30);
  report("map_iterate",(double)(lVar9 - lVar7),obj_size,start_memory_06,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               *)local_168);
  return;
}

Assistant:

static void test_all_maps(int obj_size, int iters) {
  const bool stress_hash_function = obj_size <= 8;

  if (FLAGS_test_sparse_hash_map)
    measure_map<EasyUseSparseHashMap<ObjType, int, HashFn>,
                EasyUseSparseHashMap<ObjType*, int, HashFn>>(
        "SPARSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_dense_hash_map)
    measure_map<EasyUseDenseHashMap<ObjType, int, HashFn>,
                EasyUseDenseHashMap<ObjType*, int, HashFn>>(
        "DENSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_hash_map)
    measure_map<EasyUseHashMap<ObjType, int, HashFn>,
                EasyUseHashMap<ObjType*, int, HashFn>>(
        "STANDARD HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_map)
    measure_map<EasyUseMap<ObjType, int>, EasyUseMap<ObjType*, int>>(
        "STANDARD MAP", obj_size, iters, false);
}